

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmDivs<(moira::Instr)54,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  
  cVar3 = 'd';
  lVar4 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar3;
    cVar3 = "fddivs"[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pcVar5 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar5 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar5 = '.';
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
  }
  *pcVar5 = 'w';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(op & 7));
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(op >> 9 & 7));
  return;
}

Assistant:

void
Moira::dasmDivs(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}